

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode cr_eob_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                    _Bool *peos)

{
  void *pvVar1;
  long lVar2;
  _Bool *p_Var3;
  _Bool _Var4;
  CURLcode CVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  bufq *pbVar10;
  ulong uVar11;
  char *__s;
  _Bool eos;
  size_t nread;
  size_t n;
  _Bool local_61;
  bufq *local_60;
  size_t local_58;
  size_t *local_50;
  size_t local_48;
  _Bool *local_40;
  size_t local_38;
  
  pvVar1 = reader->ctx;
  CVar5 = CURLE_OK;
  local_58 = blen;
  local_50 = pnread;
  local_40 = peos;
  if ((*(byte *)((long)pvVar1 + 0x70) & 1) == 0) {
    local_60 = (bufq *)((long)pvVar1 + 0x20);
    _Var4 = Curl_bufq_is_empty(local_60);
    blen = local_58;
    if (_Var4) {
      CVar5 = Curl_creader_read(data,reader->next,buf,local_58,&local_48,&local_61);
      sVar7 = local_48;
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      *(byte *)((long)pvVar1 + 0x70) = *(byte *)((long)pvVar1 + 0x70) & 0xfe | local_61;
      pbVar10 = local_60;
      if (local_48 != 0) {
        if ((*(long *)((long)pvVar1 + 0x60) == 0) &&
           (pvVar6 = memchr(buf,0xd,local_48), pvVar6 == (void *)0x0)) {
          *local_50 = sVar7;
          _Var4 = false;
          CVar5 = CURLE_OK;
          goto LAB_001581fa;
        }
        uVar9 = 0;
        pbVar10 = local_60;
        if (local_48 != 0) {
          uVar11 = 0;
          do {
            if (2 < *(ulong *)((long)pvVar1 + 0x60)) {
              CVar5 = Curl_bufq_cwrite(pbVar10,buf + uVar9,uVar11 - uVar9,&local_38);
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              CVar5 = Curl_bufq_cwrite(pbVar10,".",1,&local_38);
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              *(undefined8 *)((long)pvVar1 + 0x60) = 0;
              lVar2 = (data->state).infilesize;
              uVar9 = uVar11;
              pbVar10 = local_60;
              if (0 < lVar2) {
                (data->state).infilesize = lVar2 + 1;
              }
            }
            if (buf[uVar11] != ".\r\n.\r\n"[*(long *)((long)pvVar1 + 0x60) + 1]) {
              *(undefined8 *)((long)pvVar1 + 0x60) = 0;
            }
            if (buf[uVar11] == ".\r\n.\r\n"[*(long *)((long)pvVar1 + 0x60) + 1]) {
              *(long *)((long)pvVar1 + 0x60) = *(long *)((long)pvVar1 + 0x60) + 1;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < local_48);
        }
        blen = local_58;
        if ((uVar9 <= local_48 && local_48 - uVar9 != 0) &&
           (CVar5 = Curl_bufq_cwrite(local_60,buf + uVar9,local_48 - uVar9,&local_38),
           pbVar10 = local_60, CVar5 != CURLE_OK)) {
          return CVar5;
        }
      }
      CVar5 = CURLE_OK;
      if ((*(byte *)((long)pvVar1 + 0x70) & 1) != 0) {
        pcVar8 = "\r\n.\r\n";
        if (*(long *)((long)pvVar1 + 0x60) == 3) {
          pcVar8 = ".\r\n.\r\n";
        }
        __s = ".\r\n";
        if (*(long *)((long)pvVar1 + 0x60) != 2) {
          __s = pcVar8;
        }
        sVar7 = strlen(__s);
        blen = local_58;
        CVar5 = Curl_bufq_cwrite(pbVar10,__s,sVar7,&local_38);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
    }
  }
  p_Var3 = local_40;
  *local_40 = false;
  pbVar10 = (bufq *)((long)pvVar1 + 0x20);
  _Var4 = Curl_bufq_is_empty(pbVar10);
  if (_Var4) {
    *local_50 = 0;
  }
  else {
    CVar5 = Curl_bufq_cread(pbVar10,buf,blen,local_50);
  }
  if (((*(byte *)((long)pvVar1 + 0x70) & 1) != 0) && (_Var4 = Curl_bufq_is_empty(pbVar10), _Var4)) {
    *(byte *)((long)pvVar1 + 0x70) = *(byte *)((long)pvVar1 + 0x70) | 2;
  }
  _Var4 = (_Bool)(*(byte *)((long)pvVar1 + 0x70) >> 1 & 1);
  local_40 = p_Var3;
LAB_001581fa:
  *local_40 = _Var4;
  return CVar5;
}

Assistant:

static CURLcode cr_eob_read(struct Curl_easy *data,
                            struct Curl_creader *reader,
                            char *buf, size_t blen,
                            size_t *pnread, bool *peos)
{
  struct cr_eob_ctx *ctx = reader->ctx;
  CURLcode result = CURLE_OK;
  size_t nread, i, start, n;
  bool eos;

  if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* Get more and convert it when needed */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;

    ctx->read_eos = eos;
    if(nread) {
      if(!ctx->n_eob && !memchr(buf, SMTP_EOB[0], nread)) {
        /* not in the middle of a match, no EOB start found, just pass */
        *pnread = nread;
        *peos = FALSE;
        return CURLE_OK;
      }
      /* scan for EOB (continuation) and convert */
      for(i = start = 0; i < nread; ++i) {
        if(ctx->n_eob >= SMTP_EOB_FIND_LEN) {
          /* matched the EOB prefix and seeing additional char, add '.' */
          result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
          if(result)
            return result;
          result = Curl_bufq_cwrite(&ctx->buf, ".", 1, &n);
          if(result)
            return result;
          ctx->n_eob = 0;
          start = i;
          if(data->state.infilesize > 0)
            data->state.infilesize++;
        }

        if(buf[i] != SMTP_EOB[ctx->n_eob])
          ctx->n_eob = 0;

        if(buf[i] == SMTP_EOB[ctx->n_eob]) {
          /* matching another char of the EOB */
          ++ctx->n_eob;
        }
      }

      /* add any remainder to buf */
      if(start < nread) {
        result = Curl_bufq_cwrite(&ctx->buf, buf + start, nread - start, &n);
        if(result)
          return result;
      }
    }

    if(ctx->read_eos) {
      /* if we last matched a CRLF or if the data was empty, add ".\r\n"
       * to end the body. If we sent something and it did not end with "\r\n",
       * add "\r\n.\r\n" to end the body */
      const char *eob = SMTP_EOB;
      switch(ctx->n_eob) {
        case 2:
          /* seen a CRLF at the end, just add the remainder */
          eob = &SMTP_EOB[2];
          break;
        case 3:
          /* ended with '\r\n.', we should escpe the last '.' */
          eob = "." SMTP_EOB;
          break;
        default:
          break;
      }
      result = Curl_bufq_cwrite(&ctx->buf, eob, strlen(eob), &n);
      if(result)
        return result;
    }
  }

  *peos = FALSE;
  if(!Curl_bufq_is_empty(&ctx->buf)) {
    result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  }
  else
    *pnread = 0;

  if(ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
  }
  *peos = ctx->eos;
  DEBUGF(infof(data, "cr_eob_read(%zu) -> %d, %zd, %d",
         blen, result, *pnread, *peos));
  return result;
}